

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

bool __thiscall iDynTree::JointSensor::isConsistent(JointSensor *this,Model *model)

{
  JointIndex JVar1;
  ostream *poVar2;
  long lVar3;
  void *this_00;
  long *in_RDI;
  string *in_stack_00000060;
  Model *in_stack_00000068;
  LinkIndex jntIdxInModel;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [32];
  JointIndex local_20;
  bool local_1;
  
  (**(code **)(*in_RDI + 0x48))();
  JVar1 = Model::getJointIndex(in_stack_00000068,in_stack_00000060);
  std::__cxx11::string::~string(local_40);
  local_20 = JVar1;
  if (JVar1 == JOINT_INVALID_INDEX) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ERROR] Sensor ");
    (**(code **)(*in_RDI + 0x10))();
    poVar2 = std::operator<<(poVar2,local_70);
    poVar2 = std::operator<<(poVar2," is not consistent because the joint ");
    (**(code **)(*in_RDI + 0x48))(local_90);
    poVar2 = std::operator<<(poVar2,local_90);
    poVar2 = std::operator<<(poVar2," does not exist in the specified model");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
    local_1 = false;
  }
  else {
    lVar3 = (**(code **)(*in_RDI + 0x50))();
    if (JVar1 == lVar3) {
      local_1 = true;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"[ERROR] Sensor ");
      (**(code **)(*in_RDI + 0x10))();
      poVar2 = std::operator<<(poVar2,local_b0);
      poVar2 = std::operator<<(poVar2," is not consistent because it is attached to joint ");
      (**(code **)(*in_RDI + 0x48))(local_d0);
      poVar2 = std::operator<<(poVar2,local_d0);
      poVar2 = std::operator<<(poVar2," that has index ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
      poVar2 = std::operator<<(poVar2," in the model, while the sensor ");
      poVar2 = std::operator<<(poVar2," has it saved with link index ");
      lVar3 = (**(code **)(*in_RDI + 0x50))();
      this_00 = (void *)std::ostream::operator<<(poVar2,lVar3);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_b0);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool JointSensor::isConsistent(const Model& model) const
{
    LinkIndex jntIdxInModel = model.getJointIndex(this->getParentJoint());

    if (jntIdxInModel == JOINT_INVALID_INDEX)
    {
        std::cerr << "[ERROR] Sensor " << this->getName() << " is not consistent because the joint "
                  << this->getParentJoint() << " does not exist in the specified model" << std::endl;
        return false;
    }

    if (jntIdxInModel != this->getParentJointIndex())
    {
        std::cerr << "[ERROR] Sensor " << this->getName() << " is not consistent because it is attached to joint "
                  << this->getParentJoint() << " that has index " << jntIdxInModel << " in the model, while the sensor "
                  << " has it saved with link index " << this->getParentJointIndex() << std::endl;
        return false;
    }

    return true;
}